

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O2

void __thiscall Sort::selection_sort(Sort *this)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  reference pvVar4;
  uint *puVar5;
  uint uVar6;
  vector<int,_std::allocator<int>_> *__range1;
  ulong uVar7;
  int *i;
  uint *puVar8;
  
  puVar2 = (uint *)(this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar8 = (uint *)(this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(&this->data_,0);
    uVar7 = (ulong)((long)puVar8 - (long)pvVar4) >> 2;
    uVar3 = *puVar8;
    while( true ) {
      uVar3 = uVar3 + 1;
      if ((ulong)((long)(this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= (ulong)uVar3) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(&this->data_,(ulong)uVar3);
      iVar1 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(&this->data_,uVar7 & 0xffffffff);
      uVar6 = uVar3;
      if (*pvVar4 <= iVar1) {
        uVar6 = (uint)uVar7;
      }
      uVar7 = (ulong)uVar6;
    }
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::at(&this->data_,uVar7 & 0xffffffff);
    uVar3 = *puVar5;
    *puVar5 = *puVar8;
    *puVar8 = uVar3;
  }
  printArray(this);
  return;
}

Assistant:

void Sort::selection_sort()
{
    for (const auto& i : data_){
        unsigned int min_idx = &i - &data_.at(0);
        for (unsigned j = i+1; j < data_.size(); ++j)
          if (data_.at(j) < data_.at(min_idx))
            min_idx = j;
        std::swap(data_.at(min_idx), const_cast<int&>(i));
    }
    printArray();
}